

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580_tune.c
# Opt level: O0

void vepu580_h265e_tune_atf(H265eV580HalContext *ctx,RK_U32 sm_flag)

{
  H265eV580RegSet *pHVar1;
  RdoAtfSkipCfg *pRVar2;
  RdoAtfCfg *pRVar3;
  uint local_40;
  RK_U32 atf_idx;
  RdoAtfCfg *p;
  RdoAtfSkipCfg *s;
  vepu580_rdo_cfg *reg_rdo;
  H265eV580RegSet *regs;
  RK_U32 sm_flag_local;
  H265eV580HalContext *ctx_local;
  
  pHVar1 = ctx->frm->regs_set[0];
  local_40 = sm_flag;
  if ((ctx->cfg->tune).vmaf_opt != 0) {
    local_40 = 3;
  }
  pRVar2 = &(pHVar1->reg_rdo).rdo_b64_skip_atf;
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xfffff000 | 1);
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xf000ffff | 0x20000);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_cime_thd1 & 0xfffff000 | 4);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_cime_thd1 & 0xf000ffff | 0x60000);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       skip_b64_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (skip_b64_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (skip_b64_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt0 & 0xffffff |
       skip_b64_atf_wgt[local_40][3] << 0x18);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       skip_b64_atf_wgt[local_40][4] & 0xffU);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (skip_b64_atf_wgt[local_40][5] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (skip_b64_atf_wgt[local_40][6] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       skip_b64_atf_wgt[local_40][7] & 0xffU);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (skip_b64_atf_wgt[local_40][8] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (skip_b64_atf_wgt[local_40][9] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       skip_b64_atf_wgt[local_40][10] & 0xffU);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (skip_b64_atf_wgt[local_40][0xb] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b64_skip_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (skip_b64_atf_wgt[local_40][0xc] & 0xffU) << 0x10);
  pRVar3 = &(pHVar1->reg_rdo).rdo_b32_intra_atf;
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xfffff000 | 0x18);
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xf000ffff | 0x300000);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_cime_thd1 =
       (anon_struct_4_2_5cb4c5b5_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_cime_thd1 & 0xfffff000 | 0x40);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       intra_b32_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (intra_b32_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (intra_b32_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       intra_b32_atf_wgt[local_40][3] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (intra_b32_atf_wgt[local_40][4] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (intra_b32_atf_wgt[local_40][5] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       intra_b32_atf_wgt[local_40][6] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (intra_b32_atf_wgt[local_40][7] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (intra_b32_atf_wgt[local_40][8] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       intra_b32_atf_wgt[local_40][9] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (intra_b32_atf_wgt[local_40][10] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_intra_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (intra_b32_atf_wgt[local_40][0xb] & 0xffU) << 0x10);
  pRVar2 = &(pHVar1->reg_rdo).rdo_b32_skip_atf;
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xfffff000 | 1);
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xf000ffff | 0x20000);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_cime_thd1 & 0xfffff000 | 4);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_cime_thd1 & 0xf000ffff | 0x60000);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       skip_b32_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (skip_b32_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (skip_b32_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt0 & 0xffffff |
       skip_b32_atf_wgt[local_40][3] << 0x18);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       skip_b32_atf_wgt[local_40][4] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (skip_b32_atf_wgt[local_40][5] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (skip_b32_atf_wgt[local_40][6] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       skip_b32_atf_wgt[local_40][7] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (skip_b32_atf_wgt[local_40][8] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (skip_b32_atf_wgt[local_40][9] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       skip_b32_atf_wgt[local_40][10] & 0xffU);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (skip_b32_atf_wgt[local_40][0xb] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b32_skip_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (skip_b32_atf_wgt[local_40][0xc] & 0xffU) << 0x10);
  pRVar3 = &(pHVar1->reg_rdo).rdo_b16_intra_atf;
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xfffff000 | 0x18);
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xf000ffff | 0x300000);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_cime_thd1 =
       (anon_struct_4_2_5cb4c5b5_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_cime_thd1 & 0xfffff000 | 0x40);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       intra_b16_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (intra_b16_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (intra_b16_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       intra_b16_atf_wgt[local_40][3] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (intra_b16_atf_wgt[local_40][4] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (intra_b16_atf_wgt[local_40][5] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       intra_b16_atf_wgt[local_40][6] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (intra_b16_atf_wgt[local_40][7] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (intra_b16_atf_wgt[local_40][8] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       intra_b16_atf_wgt[local_40][9] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (intra_b16_atf_wgt[local_40][10] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_intra_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (intra_b16_atf_wgt[local_40][0xb] & 0xffU) << 0x10);
  pRVar2 = &(pHVar1->reg_rdo).rdo_b16_skip_atf;
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xfffff000 | 1);
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xf000ffff | 0x20000);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_cime_thd1 & 0xfffff000 | 4);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_cime_thd1 & 0xf000ffff | 0x60000);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       skip_b16_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (skip_b16_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (skip_b16_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt0 & 0xffffff |
       skip_b16_atf_wgt[local_40][3] << 0x18);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       skip_b16_atf_wgt[local_40][4] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (skip_b16_atf_wgt[local_40][5] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (skip_b16_atf_wgt[local_40][6] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       skip_b16_atf_wgt[local_40][7] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (skip_b16_atf_wgt[local_40][8] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (skip_b16_atf_wgt[local_40][9] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       skip_b16_atf_wgt[local_40][10] & 0xffU);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (skip_b16_atf_wgt[local_40][0xb] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b16_skip_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (skip_b16_atf_wgt[local_40][0xc] & 0xffU) << 0x10);
  pRVar3 = &(pHVar1->reg_rdo).rdo_b8_intra_atf;
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xfffff000 | 0x18);
  pRVar3->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar3->rdo_b_cime_thd0 & 0xf000ffff | 0x300000);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_cime_thd1 =
       (anon_struct_4_2_5cb4c5b5_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_cime_thd1 & 0xfffff000 | 0x40);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       intra_b8_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (intra_b8_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_63c431ff_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (intra_b8_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       intra_b8_atf_wgt[local_40][3] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (intra_b8_atf_wgt[local_40][4] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63d2c1a0_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (intra_b8_atf_wgt[local_40][5] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       intra_b8_atf_wgt[local_40][6] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (intra_b8_atf_wgt[local_40][7] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (intra_b8_atf_wgt[local_40][8] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       intra_b8_atf_wgt[local_40][9] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (intra_b8_atf_wgt[local_40][10] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_intra_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (intra_b8_atf_wgt[local_40][0xb] & 0xffU) << 0x10);
  pRVar2 = &(pHVar1->reg_rdo).rdo_b8_skip_atf;
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xfffff000 | 1);
  pRVar2->rdo_b_cime_thd0 =
       (anon_struct_4_4_3c7cc283_for_rdo_b_cime_thd0)
       ((uint)pRVar2->rdo_b_cime_thd0 & 0xf000ffff | 0x20000);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_cime_thd1 & 0xfffff000 | 4);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_cime_thd1 =
       (anon_struct_4_4_3c7db2c3_for_rdo_b_cime_thd1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_cime_thd1 & 0xf000ffff | 0x60000);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 & 0xffffff00 |
       skip_b8_atf_wgt[local_40][0] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 & 0xffff00ff |
       (skip_b8_atf_wgt[local_40][1] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 & 0xff00ffff |
       (skip_b8_atf_wgt[local_40][2] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 =
       (anon_struct_4_4_3ec951e1_for_rdo_b_atf_wgt0)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt0 & 0xffffff |
       skip_b8_atf_wgt[local_40][3] << 0x18);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 & 0xffffff00 |
       skip_b8_atf_wgt[local_40][4] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 & 0xffff00ff |
       (skip_b8_atf_wgt[local_40][5] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 =
       (anon_struct_4_4_63e15141_for_rdo_b_atf_wgt1)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt1 & 0xff00ffff |
       (skip_b8_atf_wgt[local_40][6] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 & 0xffffff00 |
       skip_b8_atf_wgt[local_40][7] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 & 0xffff00ff |
       (skip_b8_atf_wgt[local_40][8] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 =
       (anon_struct_4_4_63efe0e2_for_rdo_b_atf_wgt2)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt2 & 0xff00ffff |
       (skip_b8_atf_wgt[local_40][9] & 0xffU) << 0x10);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 & 0xffffff00 |
       skip_b8_atf_wgt[local_40][10] & 0xffU);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 & 0xffff00ff |
       (skip_b8_atf_wgt[local_40][0xb] & 0xffU) << 8);
  (pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 =
       (anon_struct_4_4_63fe7083_for_rdo_b_atf_wgt3)
       ((uint)(pHVar1->reg_rdo).rdo_b8_skip_atf.rdo_b_atf_wgt3 & 0xff00ffff |
       (skip_b8_atf_wgt[local_40][0xc] & 0xffU) << 0x10);
  return;
}

Assistant:

static void vepu580_h265e_tune_atf(H265eV580HalContext *ctx, RK_U32 sm_flag)
{
    H265eV580RegSet *regs = ctx->frm->regs_set[0];
    vepu580_rdo_cfg  *reg_rdo = &regs->reg_rdo;
    RdoAtfSkipCfg *s;
    RdoAtfCfg* p;
    RK_U32 atf_idx = ctx->cfg->tune.vmaf_opt ? 3 : sm_flag;

    s = &reg_rdo->rdo_b64_skip_atf;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 1;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 2;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 4;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd3 = 6;

    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = skip_b64_atf_wgt[atf_idx][0];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt10  = skip_b64_atf_wgt[atf_idx][1];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt11  = skip_b64_atf_wgt[atf_idx][2];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt12  = skip_b64_atf_wgt[atf_idx][3];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt20  = skip_b64_atf_wgt[atf_idx][4];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt21  = skip_b64_atf_wgt[atf_idx][5];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt22  = skip_b64_atf_wgt[atf_idx][6];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt30  = skip_b64_atf_wgt[atf_idx][7];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt31  = skip_b64_atf_wgt[atf_idx][8];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt32  = skip_b64_atf_wgt[atf_idx][9];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt40  = skip_b64_atf_wgt[atf_idx][10];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt41  = skip_b64_atf_wgt[atf_idx][11];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt42  = skip_b64_atf_wgt[atf_idx][12];

    p = &reg_rdo->rdo_b32_intra_atf;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 24;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 48;
    p->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 64;
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = intra_b32_atf_wgt[atf_idx][0];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt01  = intra_b32_atf_wgt[atf_idx][1];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt02  = intra_b32_atf_wgt[atf_idx][2];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt10  = intra_b32_atf_wgt[atf_idx][3];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt11  = intra_b32_atf_wgt[atf_idx][4];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt12  = intra_b32_atf_wgt[atf_idx][5];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt20  = intra_b32_atf_wgt[atf_idx][6];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt21  = intra_b32_atf_wgt[atf_idx][7];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt22  = intra_b32_atf_wgt[atf_idx][8];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt30  = intra_b32_atf_wgt[atf_idx][9];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt31  = intra_b32_atf_wgt[atf_idx][10];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt32  = intra_b32_atf_wgt[atf_idx][11];

    s = &reg_rdo->rdo_b32_skip_atf;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd0 =  1;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd1 =  2;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd2 =  4;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd3 =  6;
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  =  skip_b32_atf_wgt[atf_idx][0];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt10  =  skip_b32_atf_wgt[atf_idx][1];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt11  =  skip_b32_atf_wgt[atf_idx][2];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt12  =  skip_b32_atf_wgt[atf_idx][3];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt20  =  skip_b32_atf_wgt[atf_idx][4];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt21  =  skip_b32_atf_wgt[atf_idx][5];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt22  =  skip_b32_atf_wgt[atf_idx][6];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt30  =  skip_b32_atf_wgt[atf_idx][7];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt31  =  skip_b32_atf_wgt[atf_idx][8];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt32  =  skip_b32_atf_wgt[atf_idx][9];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt40  =  skip_b32_atf_wgt[atf_idx][10];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt41  =  skip_b32_atf_wgt[atf_idx][11];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt42  =  skip_b32_atf_wgt[atf_idx][12];

    p = &reg_rdo->rdo_b16_intra_atf;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 24;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 48;
    p->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 64;
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = intra_b16_atf_wgt[atf_idx][0];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt01  = intra_b16_atf_wgt[atf_idx][1];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt02  = intra_b16_atf_wgt[atf_idx][2];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt10  = intra_b16_atf_wgt[atf_idx][3];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt11  = intra_b16_atf_wgt[atf_idx][4];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt12  = intra_b16_atf_wgt[atf_idx][5];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt20  = intra_b16_atf_wgt[atf_idx][6];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt21  = intra_b16_atf_wgt[atf_idx][7];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt22  = intra_b16_atf_wgt[atf_idx][8];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt30  = intra_b16_atf_wgt[atf_idx][9];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt31  = intra_b16_atf_wgt[atf_idx][10];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt32  = intra_b16_atf_wgt[atf_idx][11];

    s = &reg_rdo->rdo_b16_skip_atf;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 1;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 2;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 4;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd3 = 6;
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = skip_b16_atf_wgt[atf_idx][0];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt10  = skip_b16_atf_wgt[atf_idx][1];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt11  = skip_b16_atf_wgt[atf_idx][2];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt12  = skip_b16_atf_wgt[atf_idx][3];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt20  = skip_b16_atf_wgt[atf_idx][4];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt21  = skip_b16_atf_wgt[atf_idx][5];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt22  = skip_b16_atf_wgt[atf_idx][6];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt30  = skip_b16_atf_wgt[atf_idx][7];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt31  = skip_b16_atf_wgt[atf_idx][8];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt32  = skip_b16_atf_wgt[atf_idx][9];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt40  = skip_b16_atf_wgt[atf_idx][10];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt41  = skip_b16_atf_wgt[atf_idx][11];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt42  = skip_b16_atf_wgt[atf_idx][12];

    p = &reg_rdo->rdo_b8_intra_atf;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 24;
    p->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 48;
    p->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 64;
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = intra_b8_atf_wgt[atf_idx][0];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt01  = intra_b8_atf_wgt[atf_idx][1];
    p->rdo_b_atf_wgt0.cu_rdo_atf_wgt02  = intra_b8_atf_wgt[atf_idx][2];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt10  = intra_b8_atf_wgt[atf_idx][3];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt11  = intra_b8_atf_wgt[atf_idx][4];
    p->rdo_b_atf_wgt1.cu_rdo_atf_wgt12  = intra_b8_atf_wgt[atf_idx][5];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt20  = intra_b8_atf_wgt[atf_idx][6];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt21  = intra_b8_atf_wgt[atf_idx][7];
    p->rdo_b_atf_wgt2.cu_rdo_atf_wgt22  = intra_b8_atf_wgt[atf_idx][8];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt30  = intra_b8_atf_wgt[atf_idx][9];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt31  = intra_b8_atf_wgt[atf_idx][10];
    p->rdo_b_atf_wgt3.cu_rdo_atf_wgt32  = intra_b8_atf_wgt[atf_idx][11];

    s = &reg_rdo->rdo_b8_skip_atf;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd0 = 1;
    s->rdo_b_cime_thd0.cu_rdo_cime_thd1 = 2;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd2 = 4;
    s->rdo_b_cime_thd1.cu_rdo_cime_thd3 = 6;
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt00  = skip_b8_atf_wgt[atf_idx][0];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt10  = skip_b8_atf_wgt[atf_idx][1];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt11  = skip_b8_atf_wgt[atf_idx][2];
    s->rdo_b_atf_wgt0.cu_rdo_atf_wgt12  = skip_b8_atf_wgt[atf_idx][3];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt20  = skip_b8_atf_wgt[atf_idx][4];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt21  = skip_b8_atf_wgt[atf_idx][5];
    s->rdo_b_atf_wgt1.cu_rdo_atf_wgt22  = skip_b8_atf_wgt[atf_idx][6];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt30  = skip_b8_atf_wgt[atf_idx][7];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt31  = skip_b8_atf_wgt[atf_idx][8];
    s->rdo_b_atf_wgt2.cu_rdo_atf_wgt32  = skip_b8_atf_wgt[atf_idx][9];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt40  = skip_b8_atf_wgt[atf_idx][10];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt41  = skip_b8_atf_wgt[atf_idx][11];
    s->rdo_b_atf_wgt3.cu_rdo_atf_wgt42  = skip_b8_atf_wgt[atf_idx][12];
}